

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O0

uint __thiscall
llvm::MCRegisterInfo::getSubRegIndex(MCRegisterInfo *this,MCRegister Reg,MCRegister SubReg)

{
  uint16_t *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  MCRegisterDesc *pMVar5;
  MCRegister local_48;
  uint local_44;
  undefined1 local_40 [8];
  MCSubRegIterator Subs;
  ushort *local_28;
  uint16_t *SRI;
  MCRegisterInfo *this_local;
  MCRegister local_10;
  MCRegister SubReg_local;
  MCRegister Reg_local;
  
  this_local._4_4_ = SubReg.Reg;
  local_10.Reg = Reg.Reg;
  uVar3 = MCRegister::operator_cast_to_unsigned_int((MCRegister *)((long)&this_local + 4));
  bVar2 = false;
  if (uVar3 != 0) {
    uVar3 = MCRegister::operator_cast_to_unsigned_int((MCRegister *)((long)&this_local + 4));
    uVar4 = getNumRegs(this);
    bVar2 = false;
    if (uVar3 < uVar4) {
      bVar2 = true;
    }
  }
  if (bVar2) {
    puVar1 = this->SubRegIndices;
    Subs.super_DiffListIterator.List._4_4_ = local_10.Reg;
    pMVar5 = get(this,local_10);
    local_28 = puVar1 + pMVar5->SubRegIndices;
    local_44 = local_10.Reg;
    MCSubRegIterator::MCSubRegIterator((MCSubRegIterator *)local_40,local_10,this,false);
    while( true ) {
      bVar2 = DiffListIterator::isValid((DiffListIterator *)local_40);
      if (!bVar2) {
        return 0;
      }
      local_48 = DiffListIterator::operator*((DiffListIterator *)local_40);
      bVar2 = MCRegister::operator==(&local_48,(MCRegister *)((long)&this_local + 4));
      if (bVar2) break;
      DiffListIterator::operator++((DiffListIterator *)local_40);
      local_28 = local_28 + 1;
    }
    return (uint)*local_28;
  }
  __assert_fail("SubReg && SubReg < getNumRegs() && \"This is not a register\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/MCRegisterInfo.cpp"
                ,0x2e,
                "unsigned int llvm::MCRegisterInfo::getSubRegIndex(MCRegister, MCRegister) const");
}

Assistant:

unsigned MCRegisterInfo::getSubRegIndex(MCRegister Reg,
                                        MCRegister SubReg) const {
  assert(SubReg && SubReg < getNumRegs() && "This is not a register");
  // Get a pointer to the corresponding SubRegIndices list. This list has the
  // name of each sub-register in the same order as MCSubRegIterator.
  const uint16_t *SRI = SubRegIndices + get(Reg).SubRegIndices;
  for (MCSubRegIterator Subs(Reg, this); Subs.isValid(); ++Subs, ++SRI)
    if (*Subs == SubReg)
      return *SRI;
  return 0;
}